

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llava.cpp
# Opt level: O1

void __thiscall
llava_embd_batch::llava_embd_batch
          (llava_embd_batch *this,float *embd,int32_t n_tokens,llama_pos pos_0,llama_seq_id seq_id)

{
  pointer piVar1;
  pointer piVar2;
  pointer ppiVar3;
  pointer pcVar4;
  ulong uVar5;
  size_type __new_size;
  
  __new_size = (size_type)n_tokens;
  (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->seq_ids).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->seq_ids).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->seq_id_0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->seq_ids).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->seq_id_0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->seq_id_0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->pos,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->n_seq_id,__new_size);
  std::vector<int_*,_std::allocator<int_*>_>::resize(&this->seq_ids,(long)(n_tokens + 1));
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->logits,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->seq_id_0,1);
  *(this->seq_id_0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = seq_id;
  (this->seq_ids).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_start[__new_size] = (int *)0x0;
  piVar1 = (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppiVar3 = (this->seq_ids).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar4 = (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->batch).n_tokens = n_tokens;
  (this->batch).token = (llama_token *)0x0;
  (this->batch).embd = embd;
  (this->batch).pos = piVar1;
  (this->batch).n_seq_id = piVar2;
  (this->batch).seq_id = ppiVar3;
  (this->batch).logits = pcVar4;
  if (0 < n_tokens) {
    uVar5 = 0;
    do {
      (this->batch).pos[uVar5] = pos_0 + (int)uVar5;
      (this->batch).n_seq_id[uVar5] = 1;
      (this->batch).seq_id[uVar5] =
           (this->seq_id_0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->batch).logits[uVar5] = '\0';
      uVar5 = uVar5 + 1;
    } while ((uint)n_tokens != uVar5);
  }
  return;
}

Assistant:

llava_embd_batch(float * embd, int32_t n_tokens, llama_pos pos_0, llama_seq_id seq_id) {
        pos     .resize(n_tokens);
        n_seq_id.resize(n_tokens);
        seq_ids .resize(n_tokens + 1);
        logits  .resize(n_tokens);
        seq_id_0.resize(1);
        seq_id_0[0] = seq_id;
        seq_ids [n_tokens] = nullptr;
        batch = {
            /*n_tokens       =*/ n_tokens,
            /*tokens         =*/ nullptr,
            /*embd           =*/ embd,
            /*pos            =*/ pos.data(),
            /*n_seq_id       =*/ n_seq_id.data(),
            /*seq_id         =*/ seq_ids.data(),
            /*logits         =*/ logits.data(),
        };
        for (int i = 0; i < n_tokens; i++) {
            batch.pos     [i] = pos_0 + i;
            batch.n_seq_id[i] = 1;
            batch.seq_id  [i] = seq_id_0.data();
            batch.logits  [i] = false;
        }
    }